

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O2

bool jsoncons::operator<(key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                         *lhs,key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                              *rhs)

{
  bool bVar1;
  type_conflict9 tVar2;
  bool bVar3;
  
  bVar1 = std::operator<(&lhs->key_,&rhs->key_);
  bVar3 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&lhs->key_,&rhs->key_);
    if ((bVar1) && (tVar2 = operator<(&lhs->value_,&rhs->value_), tVar2)) {
      return true;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator<(const key_value& lhs, const key_value& rhs) noexcept
        {
            if (lhs.key_ < rhs.key_)
            {
                return true;
            }
            if (lhs.key_ == rhs.key_ && lhs.value_ < rhs.value_)
            {
                return true;
            }
            return false;
        }